

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O2

void __thiscall sqvector<SQOuterVar>::~sqvector(sqvector<SQOuterVar> *this)

{
  long lVar1;
  SQUnsignedInteger i;
  ulong uVar2;
  
  if (this->_allocated != 0) {
    lVar1 = 0;
    for (uVar2 = 0; uVar2 < this->_size; uVar2 = uVar2 + 1) {
      SQOuterVar::~SQOuterVar((SQOuterVar *)((long)&this->_vals->_type + lVar1));
      lVar1 = lVar1 + 0x28;
    }
    sq_vm_free(this->_vals,this->_allocated * 0x28);
  }
  return;
}

Assistant:

~sqvector()
    {
        if(_allocated) {
            for(SQUnsignedInteger i = 0; i < _size; i++)
                _vals[i].~T();
            SQ_FREE(_vals, (_allocated * sizeof(T)));
        }
    }